

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O2

int IoTHubClient_Auth_Set_SasToken_Expiry
              (IOTHUB_AUTHORIZATION_HANDLE handle,uint64_t expiry_time_seconds)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x276;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                ,"IoTHubClient_Auth_Set_SasToken_Expiry",0x275,1,"Invalid handle value handle: NULL"
               );
    }
  }
  else if (expiry_time_seconds < 5) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x27c;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                ,"IoTHubClient_Auth_Set_SasToken_Expiry",0x27b,1,
                "Failure setting expiry time to value %lu min value is %d",expiry_time_seconds,5);
    }
  }
  else {
    handle->token_expiry_time_sec = expiry_time_seconds;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int IoTHubClient_Auth_Set_SasToken_Expiry(IOTHUB_AUTHORIZATION_HANDLE handle, uint64_t expiry_time_seconds)
{
    int result;
    if (handle == NULL)
    {
        LogError("Invalid handle value handle: NULL");
        result = MU_FAILURE;
    }
    // Validate the expiry_time in seconds
    else if (expiry_time_seconds < MIN_SAS_EXPIRY_TIME)
    {
        LogError("Failure setting expiry time to value %lu min value is %d", (unsigned long)expiry_time_seconds, MIN_SAS_EXPIRY_TIME);
        result = MU_FAILURE;
    }
    else
    {
        handle->token_expiry_time_sec = expiry_time_seconds;
        result = 0;
    }
    return result;
}